

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatHelpers.cpp
# Opt level: O3

bool slang::ast::FmtHelpers::checkSFormatArgs(ASTContext *context,Args *args)

{
  pointer ppEVar1;
  bool bVar2;
  pointer local_20;
  
  ppEVar1 = args->data_;
  local_20 = ppEVar1 + 1;
  bVar2 = true;
  if ((((StringLiteral *)*ppEVar1)->super_Expression).kind == StringLiteral) {
    bVar2 = checkFormatString(context,(StringLiteral *)*ppEVar1,&local_20,ppEVar1 + args->size_);
    if (bVar2) {
      if (local_20 == args->data_ + args->size_) {
        return true;
      }
      ASTContext::addDiag(context,(DiagCode)0x15000b,(*local_20)->sourceRange);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FmtHelpers::checkSFormatArgs(const ASTContext& context, const Args& args) {
    // If the format string is known at compile time, check it for correctness now.
    // Otherwise this will wait until runtime.
    auto argIt = args.begin();
    auto arg = *argIt++;
    if (arg->kind != ExpressionKind::StringLiteral)
        return true;

    if (!checkFormatString(context, arg->as<StringLiteral>(), argIt, args.end()))
        return false;

    // Leftover arguments are invalid (all must be consumed by the format string).
    if (argIt != args.end()) {
        context.addDiag(diag::FormatTooManyArgs, (*argIt)->sourceRange);
        return false;
    }

    return true;
}